

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hostkey_hash.c
# Opt level: O2

void calculate_digest(char *hash,size_t hash_len,char *buffer,size_t buffer_len)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = 0;
  for (lVar3 = 0; (uVar2 < hash_len && (lVar3 < 0x2000)); lVar3 = lVar3 + iVar1) {
    iVar1 = snprintf(buffer + lVar3,0x2000 - lVar3,"%02X",(ulong)(byte)hash[uVar2]);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

static void calculate_digest(const char *hash, size_t hash_len, char *buffer,
                             size_t buffer_len)
{
    size_t i;
    char *p = buffer;
    char *end = buffer + buffer_len;

    for(i = 0; i < hash_len && p < end; ++i) {
        p += snprintf(p, end - p, "%02X", (unsigned char)hash[i]);
    }
}